

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O3

void parse_gd3(byte_ *in,byte_ *end,track_info_t *out)

{
  byte_ *pbVar1;
  byte_ bVar2;
  byte_ *pbVar3;
  long lVar4;
  byte_ *pbVar5;
  
  pbVar3 = get_gd3_str(in,end,out->song);
  lVar4 = (long)end - (long)pbVar3;
  do {
    pbVar5 = pbVar3;
    if (lVar4 < 2) break;
    pbVar5 = pbVar3 + 2;
    pbVar1 = pbVar3 + 1;
    lVar4 = lVar4 + -2;
    bVar2 = *pbVar3;
    pbVar3 = pbVar5;
  } while (*pbVar1 != '\0' || bVar2 != '\0');
  pbVar3 = get_gd3_str(pbVar5,end,out->game);
  lVar4 = (long)end - (long)pbVar3;
  do {
    pbVar5 = pbVar3;
    if (lVar4 < 2) break;
    pbVar5 = pbVar3 + 2;
    pbVar1 = pbVar3 + 1;
    lVar4 = lVar4 + -2;
    bVar2 = *pbVar3;
    pbVar3 = pbVar5;
  } while (*pbVar1 != '\0' || bVar2 != '\0');
  pbVar3 = get_gd3_str(pbVar5,end,out->system);
  lVar4 = (long)end - (long)pbVar3;
  do {
    pbVar5 = pbVar3;
    if (lVar4 < 2) break;
    pbVar5 = pbVar3 + 2;
    pbVar1 = pbVar3 + 1;
    lVar4 = lVar4 + -2;
    bVar2 = *pbVar3;
    pbVar3 = pbVar5;
  } while (*pbVar1 != '\0' || bVar2 != '\0');
  pbVar3 = get_gd3_str(pbVar5,end,out->author);
  lVar4 = (long)end - (long)pbVar3;
  do {
    pbVar5 = pbVar3;
    if (lVar4 < 2) break;
    pbVar5 = pbVar3 + 2;
    pbVar1 = pbVar3 + 1;
    lVar4 = lVar4 + -2;
    bVar2 = *pbVar3;
    pbVar3 = pbVar5;
  } while (*pbVar1 != '\0' || bVar2 != '\0');
  pbVar3 = get_gd3_str(pbVar5,end,out->copyright);
  pbVar3 = get_gd3_str(pbVar3,end,out->dumper);
  lVar4 = (long)end - (long)pbVar3;
  do {
    pbVar5 = pbVar3;
    if (lVar4 < 2) break;
    pbVar5 = pbVar3 + 2;
    pbVar1 = pbVar3 + 1;
    lVar4 = lVar4 + -2;
    bVar2 = *pbVar3;
    pbVar3 = pbVar5;
  } while (*pbVar1 != '\0' || bVar2 != '\0');
  get_gd3_str(pbVar5,end,out->comment);
  return;
}

Assistant:

static void parse_gd3( byte const* in, byte const* end, track_info_t* out )
{
	in = get_gd3_pair( in, end, out->song );
	in = get_gd3_pair( in, end, out->game );
	in = get_gd3_pair( in, end, out->system );
	in = get_gd3_pair( in, end, out->author );
	in = get_gd3_str ( in, end, out->copyright );
	in = get_gd3_pair( in, end, out->dumper );
	in = get_gd3_str ( in, end, out->comment );
}